

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lf_heter_queue.h
# Opt level: O0

value_type * __thiscall
density::
lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,void()>,density::basic_default_allocator<65536ul>,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>
::
reentrant_put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>::func_queue_reentrant_put_samples(std::ostream&)::Func>
::raw_allocate_copy<char_const*>
          (reentrant_put_transaction<density_tests::LfFunctionQueueSamples<(density::function_type_erasure)1,(density::concurrency_cardinality)0,(density::concurrency_cardinality)1,(density::consistency_model)1>::func_queue_reentrant_put_samples(std::ostream&)::Func>
           *this,char *i_begin,char *i_end)

{
  size_t i_size;
  value_type *pvVar1;
  value_type *local_40;
  ValueType *curr;
  ValueType *elements;
  size_t count;
  difference_type count_s;
  char *i_end_local;
  char *i_begin_local;
  reentrant_put_transaction<Func> *this_local;
  
  i_size = std::distance<char_const*>(i_begin,i_end);
  pvVar1 = (value_type *)
           lf_heter_queue<density::detail::FunctionRuntimeType<(density::function_type_erasure)1,_void_()>,_density::basic_default_allocator<65536UL>,_(density::concurrency_cardinality)0,_(density::concurrency_cardinality)1,_(density::consistency_model)1>
           ::reentrant_put_transaction<Func>::raw_allocate
                     ((reentrant_put_transaction<Func> *)this,i_size,1);
  local_40 = pvVar1;
  for (i_end_local = i_begin; i_end_local != i_end; i_end_local = i_end_local + 1) {
    *local_40 = *i_end_local;
    local_40 = local_40 + 1;
  }
  return pvVar1;
}

Assistant:

typename std::iterator_traits<INPUT_ITERATOR>::value_type *
              raw_allocate_copy(INPUT_ITERATOR i_begin, INPUT_ITERATOR i_end)
            {
                using ValueType = typename std::iterator_traits<INPUT_ITERATOR>::value_type;
                static_assert(
                  std::is_trivially_destructible<ValueType>::value,
                  "raw_allocate_copy provides a raw memory in-place allocation that does not "
                  "invoke "
                  "destructors when deallocating");

                auto const count_s = std::distance(i_begin, i_end);
                auto const count   = static_cast<size_t>(count_s);
                DENSITY_ASSUME(static_cast<decltype(count_s)>(count) == count_s);

                auto const elements = static_cast<ValueType *>(
                  raw_allocate(sizeof(ValueType) * count, alignof(ValueType)));
                for (auto curr = elements; i_begin != i_end; ++i_begin, ++curr)
                    new (curr) ValueType(*i_begin);
                return elements;
            }